

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::InnerProductParameter::InnerProductParameter
          (InnerProductParameter *this,InnerProductParameter *from)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  undefined2 uVar4;
  FillerParameter *pFVar5;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__InnerProductParameter_0071dda0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    pFVar5 = (FillerParameter *)0x0;
  }
  else {
    pFVar5 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar5,from->weight_filler_);
  }
  this->weight_filler_ = pFVar5;
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    pFVar5 = (FillerParameter *)0x0;
  }
  else {
    pFVar5 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar5,from->bias_filler_);
  }
  this->bias_filler_ = pFVar5;
  bVar2 = from->transpose_;
  bVar3 = from->bias_term_;
  uVar4 = *(undefined2 *)&from->field_0x2e;
  this->num_output_ = from->num_output_;
  this->transpose_ = bVar2;
  this->bias_term_ = bVar3;
  *(undefined2 *)&this->field_0x2e = uVar4;
  this->axis_ = from->axis_;
  return;
}

Assistant:

InnerProductParameter::InnerProductParameter(const InnerProductParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&axis_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(axis_));
  // @@protoc_insertion_point(copy_constructor:caffe.InnerProductParameter)
}